

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.hpp
# Opt level: O1

void __thiscall gdscpp::gdscpp(gdscpp *this)

{
  this->version_number = 7;
  this->generations = 3;
  this->highest_heirarchical_level = 0;
  this->units[0] = 0.001;
  this->units[1] = 1e-09;
  (this->STR_Lookup)._M_h._M_buckets = &(this->STR_Lookup)._M_h._M_single_bucket;
  (this->STR_Lookup)._M_h._M_bucket_count = 1;
  (this->STR_Lookup)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->STR_Lookup)._M_h._M_element_count = 0;
  (this->STR_Lookup)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->STR_Lookup)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->STR_Lookup)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->last_modified).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->last_modified).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->last_modified).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->library_name)._M_dataplus._M_p = (pointer)&(this->library_name).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->library_name,"Untitled_library","");
  (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->GDSfileName).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->GDSfileName).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->GDSfileName).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

~gdscpp(){}